

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

void __thiscall QAccessibleButton::doAction(QAccessibleButton *this,QString *actionName)

{
  bool bVar1;
  QPushButton *pQVar2;
  QMenu *pQVar3;
  QPushButton *in_RSI;
  QAccessibleWidget *in_RDI;
  QPushButton *pb;
  QString *in_stack_ffffffffffffffc8;
  QPushButton *in_stack_ffffffffffffffd0;
  
  QAccessibleWidget::widget((QAccessibleWidget *)0x7ee571);
  bVar1 = QWidget::isEnabled((QWidget *)0x7ee579);
  if (bVar1) {
    pQVar2 = in_RSI;
    QAccessibleActionInterface::pressAction();
    bVar1 = ::operator==((QString *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (!bVar1) {
      in_stack_ffffffffffffffd0 = in_RSI;
      QAccessibleActionInterface::showMenuAction();
      bVar1 = ::operator==((QString *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (!bVar1) {
        QAccessibleActionInterface::toggleAction();
        bVar1 = ::operator==((QString *)in_stack_ffffffffffffffd0,(QString *)in_RSI);
        if (!bVar1) {
          QAccessibleWidget::doAction(in_RDI,(QString *)pQVar2);
          return;
        }
        button((QAccessibleButton *)0x7ee63e);
        QAbstractButton::toggle(&in_stack_ffffffffffffffd0->super_QAbstractButton);
        return;
      }
    }
    (**(code **)(*(long *)in_RDI + 0x18))();
    pQVar2 = qobject_cast<QPushButton*>((QObject *)0x7ee5d7);
    if ((pQVar2 == (QPushButton *)0x0) ||
       (pQVar3 = QPushButton::menu(in_stack_ffffffffffffffd0), pQVar3 == (QMenu *)0x0)) {
      button((QAccessibleButton *)0x7ee60a);
      QAbstractButton::animateClick(&in_stack_ffffffffffffffd0->super_QAbstractButton);
    }
    else {
      QPushButton::showMenu(in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void QAccessibleButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;
    if (actionName == pressAction() ||
        actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        QPushButton *pb = qobject_cast<QPushButton*>(object());
        if (pb && pb->menu())
            pb->showMenu();
        else
#endif
            button()->animateClick();
    } else if (actionName == toggleAction()) {
        button()->toggle();
    } else {
        QAccessibleWidget::doAction(actionName);
    }
}